

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O0

void vkt::clipping::anon_unknown_0::ClipVolume::addSimplePrograms
               (SourceCollections *programCollection,float pointSize)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  int precision;
  string local_460;
  ShaderSource local_440;
  allocator<char> local_411;
  string local_410;
  ostringstream local_3f0 [8];
  ostringstream src_1;
  string local_278;
  ShaderSource local_258;
  allocator<char> local_229;
  string local_228;
  byte local_204;
  allocator<char> local_203;
  byte local_202;
  byte local_201;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  bool usePointSize;
  float pointSize_local;
  SourceCollections *programCollection_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in vec4 v_position;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"    vec4  gl_Position;\n");
  pcVar1 = "";
  if (0.0 < pointSize) {
    pcVar1 = "    float gl_PointSize;\n";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position = v_position;\n");
  local_201 = 0;
  local_202 = 0;
  local_204 = 0;
  if (0.0 < pointSize) {
    de::floatToString_abi_cxx11_(&local_200,(de *)0x1,pointSize,precision);
    local_201 = 1;
    std::operator+(&local_1e0,"    gl_PointSize = ",&local_200);
    local_202 = 1;
    std::operator+(&local_1c0,&local_1e0,";\n");
  }
  else {
    std::allocator<char>::allocator();
    local_204 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_203);
  }
  poVar2 = std::operator<<(poVar2,(string *)&local_1c0);
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  if ((local_204 & 1) != 0) {
    std::allocator<char>::~allocator(&local_203);
  }
  if ((local_202 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  if ((local_201 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_200);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"vert",&local_229);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_228);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_258,&local_278);
  glu::ProgramSources::operator<<(pPVar3,&local_258);
  glu::VertexSource::~VertexSource((VertexSource *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_3f0);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_3f0,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 o_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    o_color = vec4(1.0, gl_FragCoord.z, 0.0, 1.0);\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"frag",&local_411);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_410);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_440,&local_460);
  glu::ProgramSources::operator<<(pPVar3,&local_440);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  std::__cxx11::ostringstream::~ostringstream(local_3f0);
  return;
}

Assistant:

void addSimplePrograms (SourceCollections& programCollection, const float pointSize = 0.0f)
{
	// Vertex shader
	{
		const bool usePointSize = pointSize > 0.0f;

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in vec4 v_position;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4  gl_Position;\n"
			<< (usePointSize ? "    float gl_PointSize;\n" : "")
			<< "};\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = v_position;\n"
			<< (usePointSize ? "    gl_PointSize = " + de::floatToString(pointSize, 1) + ";\n" : "")
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = vec4(1.0, gl_FragCoord.z, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}